

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_time.c
# Opt level: O3

void warn_cuc_decoded(guint32 s,guint32 f)

{
  byte bVar1;
  size_t i;
  long lVar2;
  guint8 b [7];
  uint local_18;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  char local_f [15];
  
  local_18 = s >> 0x18 | (s & 0xff0000) >> 8 | (s & 0xff00) << 8 | s << 0x18;
  local_14 = (char)(f >> 0x10);
  local_13 = (char)(f >> 8);
  local_12 = (char)f;
  lVar2 = 0;
  do {
    bVar1 = *(byte *)((long)&local_18 + lVar2);
    local_f[lVar2 * 2] = "0123456789abcdef"[bVar1 >> 4];
    local_f[lVar2 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 7);
  local_f[0xe] = 0;
  _p2sc_msg("warn_cuc",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_time.c"
            ,0x26,"$Id: p2sc_time.c 5348 2018-04-25 13:55:17Z bogdan $",0xce4,"Corrupted OBET: %s",
            local_f);
  return;
}

Assistant:

static void warn_cuc_decoded(guint32 s, guint32 f) {
    /* re-encode CUC */
    guint8 b[SIZEOF_CUC];
    guint32 ss = GUINT32_TO_BE(s);

    memcpy(b, &ss, 4);
    b[4] = (f >> 16) & 0xff;
    b[5] = (f >> 8) & 0xff;
    b[6] = f & 0xff;
    warn_cuc(b);
}